

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave-map.c
# Opt level: O0

void cave_light(point_set *ps)

{
  _Bool _Var1;
  uint32_t uVar2;
  square_conflict *psVar3;
  monster *mon_00;
  monster *mon;
  wchar_t chance;
  wchar_t i;
  point_set *ps_local;
  
  for (mon._4_4_ = L'\0'; mon._4_4_ < ps->n; mon._4_4_ = mon._4_4_ + L'\x01') {
    psVar3 = square((chunk *)cave,*(loc_conflict *)(ps->pts + mon._4_4_));
    flag_on_dbg(psVar3->info,3,2,"square(cave, ps->pts[i])->info","SQUARE_GLOW");
  }
  for (mon._4_4_ = L'\0'; mon._4_4_ < ps->n; mon._4_4_ = mon._4_4_ + L'\x01') {
    square_light_spot((chunk *)cave,ps->pts[mon._4_4_]);
    psVar3 = square((chunk *)cave,*(loc_conflict *)(ps->pts + mon._4_4_));
    if (0 < psVar3->mon) {
      mon._0_4_ = 0x19;
      mon_00 = square_monster((chunk *)cave,*(loc_conflict *)(ps->pts + mon._4_4_));
      _Var1 = monster_is_stupid(mon_00);
      if (_Var1) {
        mon._0_4_ = 10;
      }
      _Var1 = monster_is_smart(mon_00);
      if (_Var1) {
        mon._0_4_ = 100;
      }
      if ((mon_00->m_timed[0] != 0) && (uVar2 = Rand_div(100), (int)uVar2 < (int)mon)) {
        monster_wake(mon_00,true,L'd');
      }
    }
  }
  return;
}

Assistant:

static void cave_light(struct point_set *ps)
{
	int i;

	/* Apply flag changes */
	for (i = 0; i < ps->n; i++)	{
		/* Perma-Light */
		sqinfo_on(square(cave, ps->pts[i])->info, SQUARE_GLOW);
	}

	/* Process the grids */
	for (i = 0; i < ps->n; i++)	{
		/* Redraw the grid */
		square_light_spot(cave, ps->pts[i]);

		/* Process affected monsters */
		if (square(cave, ps->pts[i])->mon > 0) {
			int chance = 25;

			struct monster *mon = square_monster(cave, ps->pts[i]);

			/* Stupid monsters rarely wake up */
			if (monster_is_stupid(mon)) chance = 10;

			/* Smart monsters always wake up */
			if (monster_is_smart(mon)) chance = 100;

			/* Sometimes monsters wake up, and become aware if they do */
			if (mon->m_timed[MON_TMD_SLEEP] && (randint0(100) < chance)) {
				monster_wake(mon, true, 100);
			}
		}
	}
}